

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O0

Own<capnp::PipelineHook,_std::nullptr_t> __thiscall
capnp::LocalPipeline::addRef(LocalPipeline *this)

{
  PipelineHook *extraout_RDX;
  LocalPipeline *in_RSI;
  Own<capnp::PipelineHook,_std::nullptr_t> OVar1;
  Own<capnp::LocalPipeline,_std::nullptr_t> local_28;
  LocalPipeline *this_local;
  
  this_local = this;
  kj::addRef<capnp::LocalPipeline>((kj *)&local_28,in_RSI);
  kj::Own<capnp::PipelineHook,decltype(nullptr)>::Own<capnp::LocalPipeline,void>
            ((Own<capnp::PipelineHook,decltype(nullptr)> *)this,&local_28);
  kj::Own<capnp::LocalPipeline,_std::nullptr_t>::~Own(&local_28);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

kj::Own<PipelineHook> addRef() override {
    return kj::addRef(*this);
  }